

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_counting.cpp
# Opt level: O1

void counting_sort<int>(int *arr,int n)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int *__k;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> counter;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (0 < n) {
    uVar6 = (ulong)(uint)n;
    __k = arr;
    do {
      pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_60,__k);
      *pmVar2 = *pmVar2 + 1;
      __k = __k + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    iVar5 = -1;
    p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if (0 < *(int *)&p_Var3[1].field_0x4) {
        lVar4 = 0;
        do {
          arr[(long)iVar5 + lVar4 + 1] = p_Var3[1]._M_color;
          lVar4 = lVar4 + 1;
        } while ((int)lVar4 < *(int *)&p_Var3[1].field_0x4);
        iVar5 = iVar5 + (int)lVar4;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void counting_sort(T *arr, int n) {
  std::map<int, int> counter;
  for (int i = 0; i < n; ++i)
    ++counter[arr[i]];

  int j = -1;
  for (const auto &kv: counter) {
    for (auto i = 0; i < kv.second; ++i) arr[++j] = kv.first;
  }
}